

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdD3D56TlvUv::adjust_orig_mthd(MthdD3D56TlvUv *this)

{
  uint32_t *puVar1;
  MthdTest *pMVar2;
  
  if ((this->fin == true) &&
     (puVar1 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify,
     *(byte *)puVar1 = (byte)*puVar1 & 0xfe, (this->super_SingleMthdTest).super_MthdTest.cls == 0x48
     )) {
    pMVar2 = &(this->super_SingleMthdTest).super_MthdTest;
    (pMVar2->super_StateTest).exp.valid[0] = 0;
    (pMVar2->super_StateTest).exp.valid[1] = 0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin)
			insrt(orig.notify, 0, 1, 0);
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
			skip = true;
		}
	}